

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CreateTriangle
          (SACSubcaseBase *this,GLuint *vao,GLuint *vbo,GLuint *ebo)

{
  reference pvVar1;
  int local_e8;
  int i;
  allocator<unsigned_short> local_d1;
  undefined1 local_d0 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> index_data;
  float v [33];
  GLuint *ebo_local;
  GLuint *vbo_local;
  GLuint *vao_local;
  SACSubcaseBase *this_local;
  
  if (vao == (GLuint *)0x0 || vbo == (GLuint *)0x0) {
    __assert_fail("vao && vbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderAtomicCountersTests.cpp"
                  ,0x120,
                  "void gl4cts::(anonymous namespace)::SACSubcaseBase::CreateTriangle(GLuint *, GLuint *, GLuint *)"
                 );
  }
  memcpy(&index_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,&DAT_029d75d0,0x84);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1,vbo);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8892,*vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8892,0x84,
             &index_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0x88e4);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8892,0);
  if (ebo != (GLuint *)0x0) {
    std::allocator<unsigned_short>::allocator(&local_d1);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_d0,3,&local_d1);
    std::allocator<unsigned_short>::~allocator(&local_d1);
    for (local_e8 = 0; local_e8 < 3; local_e8 = local_e8 + 1) {
      pvVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_d0,
                          (long)local_e8);
      *pvVar1 = (value_type)local_e8;
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1,ebo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8893,*ebo);
    pvVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_d0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8893,8,pvVar1,
               0x88e4);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8893,0);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_d0);
  }
  glu::CallLogWrapper::glGenVertexArrays
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1,vao);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*vao);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8892,*vbo);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,2,0x1406,'\0',0x2c,
             (void *)0x0);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1,3,0x1406,'\0',0x2c,
             (void *)0x8);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,2,3,0x1406,'\0',0x2c,
             (void *)0x14);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,3,3,0x1406,'\0',0x2c,
             (void *)0x20);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,2);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,3);
  if (ebo != (GLuint *)0x0) {
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8893,*ebo);
  }
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0);
  return;
}

Assistant:

void CreateTriangle(GLuint* vao, GLuint* vbo, GLuint* ebo)
	{
		assert(vao && vbo);

		// interleaved data (vertex, color0 (green), color1 (blue), color2 (red))
		const float v[] = {
			-1.0f, -1.0f, 0.0f, 1.0f, 0.0f, 0.0f,  0.0f, 1.0f, 1.0f, 0.0f, 0.0f, 3.0f, -1.0f, 0.0f, 1.0f, 0.0f, 0.0f,
			0.0f,  1.0f,  1.0f, 0.0f, 0.0f, -1.0f, 3.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f, 1.0f,  1.0f, 0.0f, 0.0f,
		};
		glGenBuffers(1, vbo);
		glBindBuffer(GL_ARRAY_BUFFER, *vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(v), v, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		if (ebo)
		{
			std::vector<GLushort> index_data(3);
			for (int i = 0; i < 3; ++i)
			{
				index_data[i] = static_cast<GLushort>(i);
			}
			glGenBuffers(1, ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, *ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(GLushort) * 4, &index_data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, vao);
		glBindVertexArray(*vao);
		glBindBuffer(GL_ARRAY_BUFFER, *vbo);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, sizeof(float) * 11, 0);
		glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 11, reinterpret_cast<void*>(sizeof(float) * 2));
		glVertexAttribPointer(2, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 11, reinterpret_cast<void*>(sizeof(float) * 5));
		glVertexAttribPointer(3, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 11, reinterpret_cast<void*>(sizeof(float) * 8));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(3);
		if (ebo)
		{
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, *ebo);
		}
		glBindVertexArray(0);
	}